

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16collationiterator.cpp
# Opt level: O3

void __thiscall
icu_63::UTF16CollationIterator::backwardNumCodePoints
          (UTF16CollationIterator *this,int32_t num,UErrorCode *param_2)

{
  UChar *pUVar1;
  UChar *pUVar2;
  uint uVar3;
  
  if (0 < num) {
    pUVar2 = this->pos;
    uVar3 = num + 1;
    do {
      if (pUVar2 == this->start) {
        return;
      }
      pUVar1 = pUVar2 + -1;
      this->pos = pUVar1;
      if (((pUVar1 != this->start) && ((pUVar2[-1] & 0xfc00U) == 0xdc00)) &&
         ((pUVar2[-2] & 0xfc00U) == 0xd800)) {
        this->pos = pUVar2 + -2;
        pUVar1 = pUVar2 + -2;
      }
      pUVar2 = pUVar1;
      uVar3 = uVar3 - 1;
    } while (1 < uVar3);
  }
  return;
}

Assistant:

void
UTF16CollationIterator::backwardNumCodePoints(int32_t num, UErrorCode & /*errorCode*/) {
    while(num > 0 && pos != start) {
        UChar32 c = *--pos;
        --num;
        if(U16_IS_TRAIL(c) && pos != start && U16_IS_LEAD(*(pos-1))) {
            --pos;
        }
    }
}